

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O2

void protodec_getdata(int bufferlen,demod_state_t *d)

{
  byte bVar1;
  unsigned_long uVar2;
  time_t in_RCX;
  int bufferlen_00;
  int fillbits;
  time_t received_t;
  
  fillbits = 0;
  uVar2 = protodec_henten(0,6,d->rbuffer);
  if (0xffffffe4 < ((uint)uVar2 & 0xff) - 0x1c) {
    time(&received_t);
    bufferlen_00 = bufferlen;
    if (0 < bufferlen % 6) {
      fillbits = 6 - bufferlen % 6;
      bufferlen_00 = fillbits + bufferlen;
      for (in_RCX = (time_t)bufferlen; in_RCX < bufferlen_00; in_RCX = in_RCX + 1) {
        d->rbuffer[in_RCX] = '\0';
      }
    }
    protodec_generate_nmea(d,bufferlen_00,fillbits,in_RCX);
    bVar1 = d->seqnr + 1;
    if (9 < bVar1) {
      bVar1 = 0;
    }
    d->seqnr = bVar1;
  }
  return;
}

Assistant:

void protodec_getdata(int bufferlen, struct demod_state_t *d)
{
	unsigned char type = protodec_henten(0, 6, d->rbuffer);
	if (type < 1 || type > MAX_AIS_PACKET_TYPE /* 9 */)
		return;
//	unsigned long mmsi = protodec_henten(8, 30, d->rbuffer);
	int fillbits = 0;
	int k;
	time_t received_t;
	time(&received_t);
	
	if (bufferlen % 6 > 0) {
		fillbits = 6 - (bufferlen % 6);
		for (k = bufferlen; k < bufferlen + fillbits; k++)
			d->rbuffer[k] = 0;
		
		bufferlen = bufferlen + fillbits;
	}

	protodec_generate_nmea(d, bufferlen, fillbits, received_t);
	
	d->seqnr++;
	if (d->seqnr > 9)
		d->seqnr = 0;
	
	if (type < 1 || type > MAX_AIS_PACKET_TYPE)
		return; // unsupported packet type
}